

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O2

void slab_arena_destroy(slab_arena *arena)

{
  void *addr;
  void *addr_00;
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    addr_00 = lf_lifo_pop(&arena->cache);
    addr = arena->arena;
    if (addr_00 == (void *)0x0) break;
    if ((addr_00 < addr || addr == (void *)0x0) ||
       ((void *)((long)addr + arena->prealloc) <= addr_00)) {
      munmap_checked(addr_00,(ulong)arena->slab_size);
    }
    sVar1 = sVar1 + arena->slab_size;
  }
  if (addr != (void *)0x0) {
    munmap_checked(addr,arena->prealloc);
  }
  if (sVar1 == arena->used) {
    return;
  }
  __assert_fail("total == arena->used",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                ,0xe9,"void slab_arena_destroy(struct slab_arena *)");
}

Assistant:

void
slab_arena_destroy(struct slab_arena *arena)
{
	void *ptr;
	size_t total = 0;
	while ((ptr = lf_lifo_pop(&arena->cache))) {
		if (arena->arena == NULL || ptr < arena->arena ||
		    ptr >= arena->arena + arena->prealloc) {
			munmap_checked(ptr, arena->slab_size);
		}
		total += arena->slab_size;
	}
	if (arena->arena)
		munmap_checked(arena->arena, arena->prealloc);

	(void)total;
	assert(total == arena->used);
}